

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

int uv__tcp_keepalive(int fd,int on,uint delay)

{
  int iVar1;
  int *piVar2;
  int cnt;
  int intvl;
  uint delay_local;
  int on_local;
  
  delay_local = delay;
  on_local = on;
  iVar1 = setsockopt(fd,1,9,&on_local,4);
  if (iVar1 == 0) {
    if (on_local == 0) {
      return 0;
    }
    intvl = 1;
    cnt = 10;
    iVar1 = setsockopt(fd,6,4,&delay_local,4);
    if (((iVar1 == 0) && (iVar1 = setsockopt(fd,6,5,&intvl,4), iVar1 == 0)) &&
       (iVar1 = setsockopt(fd,6,6,&cnt,4), iVar1 == 0)) {
      return 0;
    }
  }
  piVar2 = __errno_location();
  return -*piVar2;
}

Assistant:

int uv__tcp_keepalive(int fd, int on, unsigned int delay) {
  if (setsockopt(fd, SOL_SOCKET, SO_KEEPALIVE, &on, sizeof(on)))
    return UV__ERR(errno);

#ifdef TCP_KEEPIDLE
  if (on) {
    int intvl = 1;  /*  1 second; same as default on Win32 */
    int cnt = 10;  /* 10 retries; same as hardcoded on Win32 */
    if (setsockopt(fd, IPPROTO_TCP, TCP_KEEPIDLE, &delay, sizeof(delay)))
      return UV__ERR(errno);
    if (setsockopt(fd, IPPROTO_TCP, TCP_KEEPINTVL, &intvl, sizeof(intvl)))
      return UV__ERR(errno);
    if (setsockopt(fd, IPPROTO_TCP, TCP_KEEPCNT, &cnt, sizeof(cnt)))
      return UV__ERR(errno);
  }
#endif

  /* Solaris/SmartOS, if you don't support keep-alive,
   * then don't advertise it in your system headers...
   */
  /* FIXME(bnoordhuis) That's possibly because sizeof(delay) should be 1. */
#if defined(TCP_KEEPALIVE) && !defined(__sun)
  if (on && setsockopt(fd, IPPROTO_TCP, TCP_KEEPALIVE, &delay, sizeof(delay)))
    return UV__ERR(errno);
#endif

  return 0;
}